

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgExpression.cpp
# Opt level: O1

float rsg::AssignOp::getWeight(GeneratorState *state,ConstValueRangeAccess valueRange)

{
  int iVar1;
  Storage SVar2;
  VariableManager *pVVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  pointer ppVVar7;
  float fVar8;
  IsWritableIntersectingEntry local_48;
  
  if (((valueRange.m_type)->m_baseType != TYPE_VOID) &&
     (bVar4 = anon_unknown_0::canAllocateVariable(state,valueRange.m_type), !bVar4)) {
    pVVar3 = state->m_varManager;
    local_48.m_valueRange.m_max = valueRange.m_max;
    local_48.m_valueRange.m_type = valueRange.m_type;
    local_48.m_valueRange.m_min = valueRange.m_min;
    ppVVar7 = (pVVar3->m_entryCache).
              super__Vector_base<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    bVar4 = ppVVar7 !=
            (pVVar3->m_entryCache).
            super__Vector_base<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
    if (bVar4) {
      bVar5 = anon_unknown_0::IsWritableIntersectingEntry::operator()(&local_48,*ppVVar7);
      while (!bVar5) {
        ppVVar7 = ppVVar7 + 1;
        bVar5 = ppVVar7 ==
                (pVVar3->m_entryCache).
                super__Vector_base<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
        bVar4 = !bVar5;
        if (bVar5) break;
        bVar5 = anon_unknown_0::IsWritableIntersectingEntry::operator()(&local_48,*ppVVar7);
      }
    }
    if (!bVar4) {
      return 0.0;
    }
  }
  if (((valueRange.m_type)->m_baseType != TYPE_VOID) &&
     (iVar1 = state->m_expressionDepth, iVar6 = getTypeConstructorDepth(valueRange.m_type),
     state->m_shaderParams->maxExpressionDepth <= iVar6 + iVar1 + 1)) {
    return 0.0;
  }
  if ((valueRange.m_type)->m_baseType == TYPE_VOID) {
    pVVar3 = state->m_varManager;
    ppVVar7 = (pVVar3->m_entryCache).
              super__Vector_base<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    while ((bVar4 = ppVVar7 !=
                    (pVVar3->m_entryCache).
                    super__Vector_base<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish, bVar4 &&
           ((SVar2 = (*ppVVar7)->m_variable->m_storage, STORAGE_PARAMETER_INOUT < SVar2 ||
            ((0xe5U >> (SVar2 & 0x1f) & 1) == 0))))) {
      ppVVar7 = ppVVar7 + 1;
    }
    if ((!bVar4) &&
       (state->m_shaderParams->maxCombinedVariableScalars <= pVVar3->m_numAllocatedScalars)) {
      return 0.0;
    }
  }
  if (state->m_expressionDepth == 0) {
    fVar8 = 4.0;
  }
  else {
    fVar8 = 0.0;
  }
  return fVar8;
}

Assistant:

float AssignOp::getWeight (const GeneratorState& state, ConstValueRangeAccess valueRange)
{
	if (!valueRange.getType().isVoid() &&
		!canAllocateVariable(state, valueRange.getType()) &&
		!state.getVariableManager().hasEntry(IsWritableIntersectingEntry(valueRange)))
		return 0.0f; // Would require creating a new variable

	if (!valueRange.getType().isVoid() && state.getExpressionDepth() + getTypeConstructorDepth(valueRange.getType()) + 1 >= state.getShaderParameters().maxExpressionDepth)
		return 0.0f;

	if (valueRange.getType().isVoid() &&
		!state.getVariableManager().hasEntry<IsWritableEntry>() &&
		state.getVariableManager().getNumAllocatedScalars() >= state.getShaderParameters().maxCombinedVariableScalars)
		return 0.0f; // Can not allocate a new entry

	if (state.getExpressionDepth() == 0)
		return 4.0f;
	else
		return 0.0f; // \todo [pyry] Fix assign ops
}